

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void flatcc_json_printer_embedded_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               flatcc_json_printer_struct_f *pf)

{
  long lVar1;
  char *pcVar2;
  size_t __n;
  size_t __n_00;
  
  if (index != 0) {
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = ',';
  }
  print_name(ctx,name,len);
  ctx->level = ctx->level + 1;
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '{';
  (*pf)(ctx,(void *)((long)p + offset));
  if (ctx->indent != '\0') {
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '\n';
    lVar1 = (long)ctx->level + -1;
    ctx->level = (int)lVar1;
    __n = (ulong)ctx->indent * lVar1;
    pcVar2 = ctx->p;
    if (ctx->pflush < pcVar2 + __n) {
      if (ctx->pflush <= pcVar2) {
        (*ctx->flush)(ctx,0);
      }
      __n_00 = (long)ctx->pflush - (long)ctx->p;
      if (__n_00 < __n) {
        do {
          memset(ctx->p,0x20,__n_00);
          ctx->p = ctx->p + __n_00;
          __n = __n - __n_00;
          (*ctx->flush)(ctx,0);
          __n_00 = (long)ctx->pflush - (long)ctx->p;
        } while (__n_00 < __n);
      }
      pcVar2 = ctx->p;
    }
    memset(pcVar2,0x20,__n);
    ctx->p = ctx->p + __n;
  }
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '}';
  return;
}

Assistant:

void flatcc_json_printer_embedded_struct_field(flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len,
        flatcc_json_printer_struct_f pf)
{
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_start('{');
    pf(ctx, (uint8_t *)p + offset);
    print_end('}');
}